

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tri_glsl.cpp
# Opt level: O3

void main_cold_1(void)

{
  GLuint in_EDI;
  GLsizei local_3fc;
  GLchar local_3f8 [1008];
  
  (*glad_glGetProgramInfoLog)(in_EDI,1000,&local_3fc,local_3f8);
  fprintf(_stderr,"Linker error:\n%s\n",local_3f8);
  return;
}

Assistant:

static void
CheckLink(GLuint prog)
{
   GLint stat;
   glGetProgramiv(prog, GL_LINK_STATUS, &stat);
   if (!stat) {
      GLchar log[1000];
      GLsizei len;
      glGetProgramInfoLog(prog, 1000, &len, log);
      fprintf(stderr, "Linker error:\n%s\n", log);
   }
}